

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sketch.c
# Opt level: O1

Integer pnga_sprs_array_count_sketch
                  (Integer s_a,Integer size_k,Integer *g_k,Integer *g_w,Integer trans)

{
  int *piVar1;
  double *pdVar2;
  size_t __size;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  double dVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  double dVar10;
  DoublePrecision DVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  double dVar16;
  Integer s_a_00;
  uint uVar17;
  Integer IVar18;
  void *pvVar19;
  long *plVar20;
  long lVar21;
  Integer IVar22;
  void *pvVar23;
  Integer *pIVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  Integer *pIVar31;
  long lVar32;
  Integer *pIVar33;
  Integer irow;
  float fVar34;
  float fVar35;
  void *vptr;
  Integer lo [2];
  Integer hi [2];
  int *jptr;
  int *iptr;
  Integer nblocks [2];
  Integer dims [2];
  Integer jhi;
  Integer jlo;
  Integer *local_128;
  long local_120;
  long local_118 [2];
  Integer *local_108;
  Integer *local_100;
  Integer *local_f0;
  Integer *local_e8;
  Integer *local_e0;
  Integer *local_d0;
  Integer local_c8;
  Integer *local_c0;
  Integer *local_b8;
  void *local_b0;
  Integer *local_a8;
  long *local_a0;
  Integer local_98;
  long local_90;
  long local_88;
  Integer local_80;
  Integer local_78 [3];
  Integer local_60;
  Integer *local_58;
  Integer *local_50;
  Integer local_40;
  Integer local_38;
  
  lVar27 = s_a + 1000;
  local_d0 = (Integer *)size_k;
  local_b8 = g_w;
  local_98 = trans;
  if (SPA[lVar27].idim < size_k) {
    pnga_error("Row dimension of sketch matrix must be less than rowdimension of original matrix",
               size_k);
  }
  local_c0 = g_k;
  local_60 = s_a;
  if (SPA[lVar27].type == 0x3f8) {
    pnga_error("Data type of sparse matrix cannot be of type long long",0x3f8);
  }
  local_120 = SPA[lVar27].ihi - SPA[lVar27].ilo;
  pIVar33 = (Integer *)(local_120 + 1);
  pIVar24 = (Integer *)SPA[lVar27].idim;
  local_a8 = (Integer *)SPA[lVar27].jdim;
  local_80 = SPA[lVar27].idx_size;
  lVar32 = SPA[lVar27].type;
  IVar18 = pnga_pgroup_nnodes(SPA[lVar27].grp);
  local_c8 = pnga_pgroup_nodeid(SPA[lVar27].grp);
  local_f0 = (Integer *)(IVar18 * 8);
  pvVar19 = malloc((size_t)local_f0);
  plVar20 = (long *)malloc(IVar18 * 8 + 8);
  if (0 < IVar18) {
    memset(pvVar19,0,(size_t)local_f0);
  }
  *(Integer **)((long)pvVar19 + local_c8 * 8) = pIVar33;
  pnga_pgroup_gop(SPA[lVar27].grp,(ulong)(local_80 != 4) + 0x3e9,pvVar19,IVar18,"+");
  *plVar20 = 1;
  if (1 < IVar18) {
    lVar21 = *plVar20;
    lVar25 = 0;
    do {
      lVar21 = lVar21 + *(long *)((long)pvVar19 + lVar25 * 8);
      plVar20[lVar25 + 1] = lVar21;
      lVar25 = lVar25 + 1;
    } while (IVar18 + -1 != lVar25);
  }
  plVar20[IVar18] = 1;
  local_78[1] = 1;
  local_f0 = (Integer *)((long)pIVar33 * 8);
  local_a0 = plVar20;
  local_78[0] = IVar18;
  local_b0 = malloc((size_t)local_f0);
  if (-1 < local_120) {
    dVar10 = (double)(long)local_d0;
    pIVar31 = (Integer *)0x0;
    do {
      DVar11 = pnga_rand(0);
      *(long *)((long)local_b0 + (long)pIVar31 * 8) = (long)(DVar11 * dVar10);
      pIVar31 = (Integer *)((long)pIVar31 + 1);
    } while (pIVar33 != pIVar31);
  }
  local_c8 = lVar27 * 200;
  pvVar19 = malloc(SPA[lVar27].size * (long)pIVar33);
  if (-1 < local_120) {
    lVar27 = 0;
    pIVar31 = pIVar33;
    do {
      DVar11 = pnga_rand(0);
      if (lVar32 - 0x3e9U < 0x10) {
        uVar17 = -(uint)((int)(DVar11 + DVar11) == 0) | 1;
        switch(lVar32) {
        case 0x3e9:
          *(uint *)((long)pvVar19 + lVar27) = uVar17;
          break;
        case 0x3ea:
        case 0x3f8:
          *(long *)((long)pvVar19 + lVar27 * 2) = (long)(int)uVar17;
          break;
        case 0x3eb:
          *(float *)((long)pvVar19 + lVar27) = (float)(int)uVar17;
          break;
        case 0x3ec:
          *(double *)((long)pvVar19 + lVar27 * 2) = (double)(int)uVar17;
          break;
        case 0x3ee:
          *(float *)((long)pvVar19 + lVar27 * 2) = (float)(int)uVar17;
          *(undefined4 *)((long)pvVar19 + lVar27 * 2 + 4) = 0;
          break;
        case 0x3ef:
          *(double *)((long)pvVar19 + lVar27 * 4) = (double)(int)uVar17;
          *(undefined8 *)((long)pvVar19 + lVar27 * 4 + 8) = 0;
        }
      }
      lVar27 = lVar27 + 4;
      pIVar31 = (Integer *)((long)pIVar31 + -1);
    } while (pIVar31 != (Integer *)0x0);
  }
  IVar22 = pnga_create_handle();
  pIVar31 = local_b8;
  IVar18 = local_c8;
  *local_b8 = IVar22;
  local_58 = pIVar24;
  pnga_set_data(IVar22,1,(Integer *)&local_58,*(Integer *)((long)&SPA->type + local_c8));
  plVar20 = local_a0;
  pnga_set_irreg_distr(*pIVar31,local_a0,local_78);
  pnga_set_pgroup(*pIVar31,*(Integer *)((long)&SPA->grp + IVar18));
  pnga_allocate(*pIVar31);
  IVar22 = pnga_create_handle();
  pIVar24 = local_c0;
  *local_c0 = IVar22;
  pnga_set_data(IVar22,1,(Integer *)&local_58,0x3e9);
  pnga_set_irreg_distr(*pIVar24,plVar20,local_78);
  pnga_set_pgroup(*pIVar24,*(Integer *)((long)&SPA->grp + IVar18));
  pnga_allocate(*pIVar24);
  local_108 = (Integer *)(*(long *)((long)&SPA->ilo + IVar18) + 1);
  local_e8 = (Integer *)(*(long *)((long)&SPA->ihi + IVar18) + 1);
  local_128 = pIVar33;
  pvVar23 = malloc((long)pIVar33 * 4);
  if (-1 < local_120) {
    lVar27 = 0;
    do {
      *(undefined4 *)((long)pvVar23 + lVar27 * 4) = *(undefined4 *)((long)local_b0 + lVar27 * 8);
      lVar27 = lVar27 + 1;
    } while (local_120 + 1 != lVar27);
  }
  pnga_put(*pIVar24,(Integer *)&local_108,(Integer *)&local_e8,pvVar23,(Integer *)&local_128);
  free(pvVar23);
  pnga_put(*pIVar31,(Integer *)&local_108,(Integer *)&local_e8,pvVar19,(Integer *)&local_128);
  pnga_pgroup_sync(*(Integer *)((long)&SPA->grp + IVar18));
  IVar22 = pnga_create_handle();
  pIVar33 = local_d0;
  local_50 = local_d0;
  local_58 = local_a8;
  if (local_98 == 0) {
    local_50 = local_a8;
    local_58 = local_d0;
  }
  pnga_set_data(IVar22,2,(Integer *)&local_58,*(Integer *)((long)&SPA->type + IVar18));
  pnga_set_pgroup(IVar22,*(Integer *)((long)&SPA->grp + IVar18));
  pnga_allocate(IVar22);
  pnga_zero(IVar22);
  __size = (long)pIVar33 * 8;
  pIVar24 = (Integer *)malloc(__size);
  local_c0 = (Integer *)malloc((size_t)local_f0);
  if (0 < (long)pIVar33) {
    memset(pIVar24,0xff,__size);
  }
  pIVar31 = local_a8;
  pIVar33 = local_c0;
  if (-1 < local_120) {
    lVar27 = 0;
    do {
      lVar21 = *(long *)((long)local_b0 + lVar27 * 8);
      *(Integer *)((long)local_c0 + lVar27 * 8) = pIVar24[lVar21];
      pIVar24[lVar21] = lVar27;
      lVar27 = lVar27 + 1;
    } while (local_120 + 1 != lVar27);
  }
  pvVar23 = malloc(*(long *)((long)&SPA->size + IVar18) * (long)local_a8);
  if (local_98 == 0) {
    local_100 = (Integer *)0x1;
    local_e0 = pIVar31;
    pIVar31 = (Integer *)0x1;
  }
  else {
    local_108 = (Integer *)0x1;
    local_e8 = pIVar31;
  }
  local_128 = pIVar31;
  if (0 < (long)local_d0) {
    pIVar31 = (Integer *)0x0;
    uVar26 = lVar32 - 0x3e9;
    local_a0 = pIVar24;
    do {
      lVar27 = local_a0[(long)pIVar31];
      local_f0 = pIVar31;
      if (-1 < lVar27) {
        memset(pvVar23,0,*(long *)((long)&SPA->size + IVar18) * (long)local_a8);
        local_b8 = (Integer *)((long)local_f0 + 1);
        do {
          if (local_98 == 0) {
            local_108 = local_b8;
            local_e8 = local_b8;
          }
          else {
            local_100 = local_b8;
            local_e0 = local_b8;
          }
          if (0 < *(long *)((long)&SPA->nblocks + IVar18)) {
            local_120 = lVar27 * 2 + 1;
            lVar32 = 0;
            do {
              s_a_00 = local_60;
              pnga_sprs_array_column_distribution
                        (local_60,*(Integer *)(*(long *)((long)&SPA->blkidx + IVar18) + lVar32 * 8),
                         &local_38,&local_40);
              if (local_80 == 4) {
                pnga_sprs_array_access_col_block(s_a_00,lVar32,&local_88,&local_90,local_118);
                iVar7 = *(int *)(local_88 + 4 + lVar27 * 4);
                iVar8 = *(int *)(local_88 + lVar27 * 4);
                uVar17 = iVar7 - iVar8;
                if (uVar17 != 0 && iVar8 <= iVar7) {
                  uVar28 = 0;
                  do {
                    if (uVar26 < 0x10) {
                      lVar25 = (long)*(int *)(local_88 + lVar27 * 4) + uVar28;
                      lVar21 = (long)*(int *)(local_90 + lVar25 * 4);
                      switch(uVar26) {
                      case 0:
                        piVar1 = (int *)((long)pvVar23 + lVar21 * 4);
                        *piVar1 = *piVar1 + *(int *)(local_118[0] + lVar25 * 4) *
                                            *(int *)((long)pvVar19 + lVar27 * 4);
                        break;
                      case 1:
                      case 0xf:
                        plVar20 = (long *)((long)pvVar23 + lVar21 * 8);
                        *plVar20 = *plVar20 +
                                   *(long *)(local_118[0] + lVar25 * 8) *
                                   *(long *)((long)pvVar19 + lVar27 * 8);
                        break;
                      case 2:
                        *(float *)((long)pvVar23 + lVar21 * 4) =
                             *(float *)((long)pvVar19 + lVar27 * 4) *
                             *(float *)(local_118[0] + lVar25 * 4) +
                             *(float *)((long)pvVar23 + lVar21 * 4);
                        break;
                      case 3:
                        *(double *)((long)pvVar23 + lVar21 * 8) =
                             *(double *)((long)pvVar19 + lVar27 * 8) *
                             *(double *)(local_118[0] + lVar25 * 8) +
                             *(double *)((long)pvVar23 + lVar21 * 8);
                        break;
                      case 5:
                        fVar3 = *(float *)((long)pvVar19 + local_120 * 4);
                        uVar5 = *(undefined8 *)(local_118[0] + lVar25 * 8);
                        fVar4 = *(float *)((long)pvVar19 + lVar27 * 8);
                        fVar34 = (float)uVar5;
                        fVar35 = (float)((ulong)uVar5 >> 0x20);
                        uVar5 = *(undefined8 *)((long)pvVar23 + lVar21 * 8);
                        *(ulong *)((long)pvVar23 + lVar21 * 8) =
                             CONCAT44((float)((ulong)uVar5 >> 0x20) +
                                      fVar4 * fVar35 + fVar34 * fVar3,
                                      (float)uVar5 + fVar4 * fVar34 + fVar35 * -fVar3);
                        break;
                      case 6:
                        dVar10 = *(double *)((long)pvVar19 + local_120 * 8);
                        pdVar2 = (double *)(local_118[0] + lVar25 * 0x10);
                        dVar15 = *pdVar2;
                        dVar16 = pdVar2[1];
                        dVar6 = *(double *)((long)pvVar19 + lVar27 * 0x10);
                        pdVar2 = (double *)((long)pvVar23 + lVar21 * 0x10);
                        dVar14 = pdVar2[1] + dVar6 * dVar16 + dVar15 * dVar10;
                        auVar12._8_4_ = SUB84(dVar14,0);
                        auVar12._0_8_ = *pdVar2 + dVar6 * dVar15 + dVar16 * -dVar10;
                        auVar12._12_4_ = (int)((ulong)dVar14 >> 0x20);
                        *(undefined1 (*) [16])((long)pvVar23 + lVar21 * 0x10) = auVar12;
                      }
                    }
                    uVar28 = uVar28 + 1;
                  } while (uVar17 != uVar28);
                }
              }
              else {
                pnga_sprs_array_access_col_block(s_a_00,lVar32,&local_88,&local_90,local_118);
                lVar21 = *(long *)(local_88 + 8 + lVar27 * 8);
                lVar25 = *(long *)(local_88 + lVar27 * 8);
                if (lVar25 < lVar21) {
                  lVar29 = 0;
                  do {
                    if (uVar26 < 0x10) {
                      lVar30 = *(long *)(local_88 + lVar27 * 8) + lVar29;
                      lVar9 = *(long *)(local_90 + lVar30 * 8);
                      switch(uVar26) {
                      case 0:
                        piVar1 = (int *)((long)pvVar23 + lVar9 * 4);
                        *piVar1 = *piVar1 + *(int *)(local_118[0] + lVar30 * 4) *
                                            *(int *)((long)pvVar19 + lVar27 * 4);
                        break;
                      case 1:
                      case 0xf:
                        plVar20 = (long *)((long)pvVar23 + lVar9 * 8);
                        *plVar20 = *plVar20 +
                                   *(long *)(local_118[0] + lVar30 * 8) *
                                   *(long *)((long)pvVar19 + lVar27 * 8);
                        break;
                      case 2:
                        *(float *)((long)pvVar23 + lVar9 * 4) =
                             *(float *)((long)pvVar19 + lVar27 * 4) *
                             *(float *)(local_118[0] + lVar30 * 4) +
                             *(float *)((long)pvVar23 + lVar9 * 4);
                        break;
                      case 3:
                        *(double *)((long)pvVar23 + lVar9 * 8) =
                             *(double *)((long)pvVar19 + lVar27 * 8) *
                             *(double *)(local_118[0] + lVar30 * 8) +
                             *(double *)((long)pvVar23 + lVar9 * 8);
                        break;
                      case 5:
                        fVar3 = *(float *)((long)pvVar19 + local_120 * 4);
                        uVar5 = *(undefined8 *)(local_118[0] + lVar30 * 8);
                        fVar4 = *(float *)((long)pvVar19 + lVar27 * 8);
                        fVar34 = (float)uVar5;
                        fVar35 = (float)((ulong)uVar5 >> 0x20);
                        uVar5 = *(undefined8 *)((long)pvVar23 + lVar9 * 8);
                        *(ulong *)((long)pvVar23 + lVar9 * 8) =
                             CONCAT44((float)((ulong)uVar5 >> 0x20) +
                                      fVar4 * fVar35 + fVar34 * fVar3,
                                      (float)uVar5 + fVar4 * fVar34 + fVar35 * -fVar3);
                        break;
                      case 6:
                        dVar10 = *(double *)((long)pvVar19 + local_120 * 8);
                        pdVar2 = (double *)(local_118[0] + lVar30 * 0x10);
                        dVar15 = *pdVar2;
                        dVar16 = pdVar2[1];
                        dVar6 = *(double *)((long)pvVar19 + lVar27 * 0x10);
                        pdVar2 = (double *)((long)pvVar23 + lVar9 * 0x10);
                        dVar14 = pdVar2[1] + dVar6 * dVar16 + dVar15 * dVar10;
                        auVar13._8_4_ = SUB84(dVar14,0);
                        auVar13._0_8_ = *pdVar2 + dVar6 * dVar15 + dVar16 * -dVar10;
                        auVar13._12_4_ = (int)((ulong)dVar14 >> 0x20);
                        *(undefined1 (*) [16])((long)pvVar23 + lVar9 * 0x10) = auVar13;
                      }
                    }
                    lVar29 = lVar29 + 1;
                  } while (lVar21 - lVar25 != lVar29);
                }
              }
              lVar32 = lVar32 + 1;
              IVar18 = local_c8;
            } while (lVar32 < *(long *)((long)&SPA->nblocks + local_c8));
          }
          pIVar33 = local_c0;
          lVar27 = *(long *)((long)local_c0 + lVar27 * 8);
        } while (-1 < lVar27);
        switch(uVar26) {
        case 0:
          local_118[0] = CONCAT44(local_118[0]._4_4_,1);
          break;
        case 1:
        case 0xf:
          local_118[0] = 1;
          break;
        case 2:
          local_118[0] = CONCAT44(local_118[0]._4_4_,0x3f800000);
          break;
        case 3:
          local_118[0] = 0x3ff0000000000000;
          break;
        default:
          goto switchD_001492b2_caseD_4;
        case 5:
          local_118[0] = 0x3f800000;
          break;
        case 6:
          local_118[0] = 0x3ff0000000000000;
          local_118[1] = 0;
        }
        pnga_acc(IVar22,(Integer *)&local_108,(Integer *)&local_e8,pvVar23,(Integer *)&local_128,
                 local_118);
      }
switchD_001492b2_caseD_4:
      pIVar31 = (Integer *)((long)local_f0 + 1);
      pIVar24 = local_a0;
    } while (pIVar31 != local_d0);
  }
  pnga_pgroup_sync(*(Integer *)((long)&SPA->grp + IVar18));
  free(pvVar23);
  free(local_b0);
  free(pvVar19);
  free(pIVar24);
  free(pIVar33);
  return IVar22;
}

Assistant:

Integer pnga_sprs_array_count_sketch(Integer s_a, Integer size_k,
    Integer *g_k, Integer *g_w, Integer trans)
{
  Integer i, ii, j, jj, n, hdl, g_a;
  Integer nrows;
  hdl = s_a + GA_OFFSET;
  Integer *klabels;
  void *kweights;
  Integer idim, jdim;
  Integer dims[2];
  Integer one = 1;
  Integer two = 2;
  Integer nblocks[2];
  Integer *top;
  Integer *list;
  void *kbuf;
  Integer nprocs, me;
  Integer k, kk, kcnt;
  Integer idx_size;
  Integer type;
  Integer lo[2], hi[2], ld;
  Integer *map, *size;
  if (SPA[hdl].idim < size_k) {
    pnga_error("Row dimension of sketch matrix must be less than row"
        "dimension of original matrix",size_k);
  }
  /* accumulate operation does not support type C_LONGLONG so fail if this
   *    * data type encountered */
  if (SPA[hdl].type == C_LONGLONG) {
    pnga_error("Data type of sparse matrix"
        " cannot be of type long long",SPA[hdl].type);
  }
  /* how many rows do I own */
  nrows = SPA[hdl].ihi-SPA[hdl].ilo+1;
  idim = SPA[hdl].idim;
  jdim = SPA[hdl].jdim;
  idx_size = SPA[hdl].idx_size;
  type = SPA[hdl].type;
  nprocs = pnga_pgroup_nnodes(SPA[hdl].grp);
  me = pnga_pgroup_nodeid(SPA[hdl].grp);
  /* create map array */
  size = (Integer*)malloc(nprocs*sizeof(Integer));
  map = (Integer*)malloc((nprocs+1)*sizeof(Integer));
  for (i=0; i<nprocs; i++) size[i] = 0;
  size[me] = nrows;
  if (idx_size == 4) {
    pnga_pgroup_gop(SPA[hdl].grp,C_INT,size,nprocs,"+");
  } else {
    pnga_pgroup_gop(SPA[hdl].grp,C_LONG,size,nprocs,"+");
  }
  map[0] = 1;
  for (i=1; i<nprocs; i++) {
    map[i] = map[i-1] + size[i-1];
  }
  map[nprocs] = 1;
  nblocks[0] = nprocs;
  nblocks[1] = 1;
  /* Assign each row to a label in the range  [0,size_k-1] */
  klabels = (Integer*)malloc(nrows*sizeof(Integer));
  for (i=0; i<nrows; i++) {
    klabels[i] = (Integer)(((double)size_k)*pnga_rand(0));
  }
  /* Assign each row a weight +/-1 */
  kweights = malloc(nrows*SPA[hdl].size);
  for (i=0; i<nrows; i++) {
    int val = (int)(2.0*pnga_rand(0));
    if (val == 0) {
      val = -1;
    } else {
      val = 1;
    }
    if (type == C_INT) {
      ((int*)kweights)[i] = val;
    } else if (type == C_LONG) {
      ((long*)kweights)[i] = (long)val;
    } else if (type == C_LONGLONG) {
      ((long long*)kweights)[i] = (long long)val;
    } else if (type == C_FLOAT) {
      ((float*)kweights)[i] = (float)val;
    } else if (type == C_DBL) {
      ((double*)kweights)[i] = (double)val;
    } else if (type == C_SCPL) {
      ((float*)kweights)[2*i] = (float)val;
      ((float*)kweights)[2*i+1] = 0.0;
    } else if (type == C_DCPL) {
      ((double*)kweights)[2*i] = (double)val;
      ((double*)kweights)[2*i+1] = 0.0;
    }
  }
  /* create distributed vectors to hold values in kweights and klabels */
  *g_w = pnga_create_handle();
  dims[0] = idim;
  pnga_set_data(*g_w,one,dims,SPA[hdl].type);
  pnga_set_irreg_distr(*g_w,map,nblocks);
  pnga_set_pgroup(*g_w,SPA[hdl].grp);
  pnga_allocate(*g_w);

  *g_k = pnga_create_handle();
  pnga_set_data(*g_k,one,dims,C_INT);
  pnga_set_irreg_distr(*g_k,map,nblocks);
  pnga_set_pgroup(*g_k,SPA[hdl].grp);
  pnga_allocate(*g_k);

  /* fill k-label and weight arrays */
  lo[0] = SPA[hdl].ilo+1; 
  hi[0] = SPA[hdl].ihi+1; 
  ld = nrows;
  kbuf = malloc(nrows*sizeof(int));
  for (i=0; i<nrows; i++) {
    ((int*)kbuf)[i] = (int)klabels[i];
  }
  pnga_put(*g_k,lo,hi,kbuf,&ld);
  free(kbuf);
  pnga_put(*g_w,lo,hi,kweights,&ld);
  pnga_pgroup_sync(SPA[hdl].grp);
  /* Create an output matrix of size_k by jdim */
  g_a = pnga_create_handle();
  if (trans) {
    dims[0] = jdim;
    dims[1] = size_k;
  } else {
    dims[0] = size_k;
    dims[1] = jdim;
  }
  pnga_set_data(g_a,two,dims,SPA[hdl].type);
  pnga_set_pgroup(g_a,SPA[hdl].grp);
  pnga_allocate(g_a);
  pnga_zero(g_a);

  /* create a linked list of rows that map to each k-index */
  top = (Integer*)malloc(size_k*sizeof(Integer));
  list = (Integer*)malloc(nrows*sizeof(Integer));
  for (i=0; i<size_k; i++) top[i] = -1;
  for (i=0; i<nrows; i++) {
    list[i] = top[klabels[i]];
    top[klabels[i]] = i;
  }
  
  /* loop over all values of k */
  kbuf = malloc(jdim*SPA[hdl].size);
  if (trans) {
    lo[0] = 1;
    hi[0] = jdim;
    ld = jdim;
  } else {
    lo[1] = 1;
    hi[1] = jdim;
    ld = 1;
  }
  for (kk = 0; kk<size_k; kk++) {
    /* accumulate all non-zero values that contribute to this value of k */
    if (top[kk] > -1) {
      Integer irow = top[kk];
      memset(kbuf,0,jdim*SPA[hdl].size);
      while (irow > -1) {
        /* loop over column blocks */
        if (trans) {
          lo[1] = kk+1;
          hi[1] = kk+1;
        } else {
          lo[0] = kk+1;
          hi[0] = kk+1;
        }
        for (n=0; n<SPA[hdl].nblocks; n++) {
          Integer nblk = SPA[hdl].blkidx[n];
          void *vptr;
          Integer jlo, jhi;
          pnga_sprs_array_column_distribution(s_a,nblk,&jlo,&jhi);
          if (idx_size == 4) {
            int *iptr;
            int *jptr;
            pnga_sprs_array_access_col_block(s_a,n,&iptr,&jptr,&vptr);
            Integer idx = irow;
            Integer kcols = iptr[idx+1]-iptr[idx];
            for (k = 0; k<kcols; k++) {
              Integer jdx = jptr[iptr[idx]+k];
              if (type == C_INT) {
                ((int*)kbuf)[jdx] += ((int*)kweights)[idx]*
                  ((int*)vptr)[iptr[idx]+k];
              } else if (type == C_LONG) {
                ((long*)kbuf)[jdx] += ((long*)kweights)[idx]*
                  ((long*)vptr)[iptr[idx]+k];
              } else if (type == C_LONGLONG) {
                ((long long*)kbuf)[jdx] += ((long long*)kweights)[idx]*
                  ((long long*)vptr)[iptr[idx]+k];
              } else if (type == C_FLOAT) {
                ((float*)kbuf)[jdx] += ((float*)kweights)[idx]*
                  ((float*)vptr)[iptr[idx]+k];
              } else if (type == C_DBL) {
                ((double*)kbuf)[jdx] += ((double*)kweights)[idx]*
                  ((double*)vptr)[iptr[idx]+k];
              } else if (type == C_SCPL) {
                float rw, iw, rv, iv;
                rw = ((float*)kweights)[2*idx];
                iw = ((float*)kweights)[2*idx+1];
                rv = ((float*)vptr)[2*(iptr[idx]+k)];
                iv = ((float*)vptr)[2*(iptr[idx]+k)+1];
                ((float*)kbuf)[2*jdx] += rw*rv-iw*iv;
                ((float*)kbuf)[2*jdx+1] += rw*iv+iw*rv;
              } else if (type == C_DCPL) {
                double rw, iw, rv, iv;
                rw = ((double*)kweights)[2*idx];
                iw = ((double*)kweights)[2*idx+1];
                rv = ((double*)vptr)[2*(iptr[idx]+k)];
                iv = ((double*)vptr)[2*(iptr[idx]+k)+1];
                ((double*)kbuf)[2*jdx] += rw*rv-iw*iv;
                ((double*)kbuf)[2*jdx+1] += rw*iv+iw*rv;
              }
            }
          } else {
            int64_t *iptr;
            int64_t *jptr;
            pnga_sprs_array_access_col_block(s_a,n,&iptr,&jptr,&vptr);
            Integer idx = irow;
            Integer kcols = iptr[idx+1]-iptr[idx];
            for (k = 0; k<kcols; k++) {
              Integer jdx = jptr[iptr[idx]+k];
              if (type == C_INT) {
                ((int*)kbuf)[jdx] += ((int*)kweights)[idx]*
                  ((int*)vptr)[iptr[idx]+k];
              } else if (type == C_LONG) {
                ((long*)kbuf)[jdx] += ((long*)kweights)[idx]*
                  ((long*)vptr)[iptr[idx]+k];
              } else if (type == C_LONGLONG) {
                ((long long*)kbuf)[jdx] += ((long long*)kweights)[idx]*
                  ((long long*)vptr)[iptr[idx]+k];
              } else if (type == C_FLOAT) {
                ((float*)kbuf)[jdx] += ((float*)kweights)[idx]*
                  ((float*)vptr)[iptr[idx]+k];
              } else if (type == C_DBL) {
                ((double*)kbuf)[jdx] += ((double*)kweights)[idx]*
                  ((double*)vptr)[iptr[idx]+k];
              } else if (type == C_SCPL) {
                float rw, iw, rv, iv;
                rw = ((float*)kweights)[2*idx];
                iw = ((float*)kweights)[2*idx+1];
                rv = ((float*)vptr)[2*(iptr[idx]+k)];
                iv = ((float*)vptr)[2*(iptr[idx]+k)+1];
                ((float*)kbuf)[2*jdx] += rw*rv-iw*iv;
                ((float*)kbuf)[2*jdx+1] += rw*iv+iw*rv;
              } else if (type == C_DCPL) {
                double rw, iw, rv, iv;
                rw = ((double*)kweights)[2*idx];
                iw = ((double*)kweights)[2*idx+1];
                rv = ((double*)vptr)[2*(iptr[idx]+k)];
                iv = ((double*)vptr)[2*(iptr[idx]+k)+1];
                ((double*)kbuf)[2*jdx] += rw*rv-iw*iv;
                ((double*)kbuf)[2*jdx+1] += rw*iv+iw*rv;
              }
            }
          }
        }
        irow = list[irow];
      }
      /* accumulate row into g_a */
      if (type == C_INT) {
        int ione = 1;
        pnga_acc(g_a, lo, hi, kbuf, &ld, &ione);
      } else if (type == C_LONG) {
        long lone = 1;
        pnga_acc(g_a, lo, hi, kbuf, &ld, &lone);
      } else if (type == C_LONGLONG) {
        long long llone = 1;
        pnga_acc(g_a, lo, hi, kbuf, &ld, &llone);
      } else if (type == C_FLOAT) {
        float fone = 1.0;
        pnga_acc(g_a, lo, hi, kbuf, &ld, &fone);
      } else if (type == C_DBL) {
        double done = 1.0;
        pnga_acc(g_a, lo, hi, kbuf, &ld, &done);
      } else if (type == C_SCPL) {
        float cone[2];
        cone[0] = 1.0;
        cone[1] = 0.0;
        pnga_acc(g_a, lo, hi, kbuf, &ld, &cone);
      } else if (type == C_DCPL) {
        double zone[2];
        zone[0] = 1.0;
        zone[1] = 0.0;
        pnga_acc(g_a, lo, hi, kbuf, &ld, &zone);
      }
    }
  }
  pnga_pgroup_sync(SPA[hdl].grp);

  /* free up arrays */
  free(kbuf);
  free(klabels);
  free(kweights);
  free(top);
  free(list);
  return g_a;
}